

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O0

void __thiscall Args_Simple_Test::TestBody(Args_Simple_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  char **ppcVar8;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__2;
  char **argv_1;
  int nthreads_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  char **argv;
  int nthreads;
  anon_class_1_0_00000001 expectNoError;
  undefined8 in_stack_fffffffffffffcf8;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd08;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffd10;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd1c;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  char *in_stack_fffffffffffffd20;
  char *file;
  Type in_stack_fffffffffffffd2c;
  Type type;
  allocator<char> *in_stack_fffffffffffffd30;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  char *in_stack_fffffffffffffd60;
  AssertionResult *this_03;
  undefined6 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6e;
  char *expression_text;
  undefined7 in_stack_fffffffffffffd78;
  AssertHelper *this_04;
  string local_268 [48];
  AssertionResult local_238;
  string *in_stack_fffffffffffffde0;
  AssertionResult local_210;
  string local_200 [48];
  char local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [32];
  AssertionResult local_188;
  undefined1 local_171 [33];
  char **local_150;
  undefined4 local_144;
  string local_140 [16];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  char ***in_stack_fffffffffffffee8;
  AssertionResult local_110 [2];
  undefined4 local_ec;
  AssertionResult local_e8;
  string local_d8 [48];
  char local_a8 [39];
  undefined8 local_81;
  AssertionResult local_60 [2];
  allocator<char> local_39;
  string local_38 [32];
  char **local_18;
  undefined4 local_10;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffcf8 >> 0x38);
  local_10 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  ppcVar8 = makeArgs(in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  this_04 = (AssertHelper *)&local_81;
  local_18 = ppcVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  expression_text = local_a8;
  std::function<void(std::__cxx11::string)>::function<Args_Simple_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  uVar1 = pbrt::ParseArg<int*>
                    (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (bool)uVar5);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58ab8f);
  std::__cxx11::string::~string((string *)((long)&local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),expression_text,
               (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68))
               ,in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
               in_stack_fffffffffffffd20,
               CONCAT13(in_stack_fffffffffffffd1f,
                        CONCAT12(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd1c)),
               (char *)in_stack_fffffffffffffd10);
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x58ad2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58ada7);
  local_ec = 4;
  this_03 = &local_e8;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd1f,
                              CONCAT16(in_stack_fffffffffffffd1e,
                                       CONCAT24(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                                      )),(char *)in_stack_fffffffffffffd10,
             (int *)in_stack_fffffffffffffd08,
             (int *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::AssertionResult::failure_message((AssertionResult *)0x58ae48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
               in_stack_fffffffffffffd20,
               CONCAT13(in_stack_fffffffffffffd1f,
                        CONCAT12(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd1c)),
               (char *)in_stack_fffffffffffffd10);
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::Message::~Message((Message *)0x58aea5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58aefa);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (bool)uVar5);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(local_110);
  if (!bVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),expression_text,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffd68)),&this_03->success_)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
               in_stack_fffffffffffffd20,
               CONCAT13(in_stack_fffffffffffffd1f,
                        CONCAT12(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd1c)),
               (char *)in_stack_fffffffffffffd10);
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_140);
    testing::Message::~Message((Message *)0x58b013);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58b08e);
  local_144 = 0;
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  ppcVar8 = makeArgs(in_stack_fffffffffffffde0);
  std::__cxx11::string::~string((string *)(local_171 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_171);
  __a = &local_1a9;
  local_150 = ppcVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)ppcVar8,__a);
  file = local_1d0;
  std::function<void(std::__cxx11::string)>::function<Args_Simple_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  bVar4 = pbrt::ParseArg<int*>
                    (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0);
  type = CONCAT13(bVar4,(int3)in_stack_fffffffffffffd2c);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (bool)uVar5);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58b196);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!(bool)uVar5) {
    testing::Message::Message((Message *)__a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),expression_text,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffd68)),&this_03->success_)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,file,
               CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd1c)),
               (char *)in_stack_fffffffffffffd10);
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_200);
    testing::Message::~Message((Message *)0x58b348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58b3c0);
  this_01 = &local_210;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffd1e,
                                             CONCAT24(in_stack_fffffffffffffd1c,
                                                      in_stack_fffffffffffffd18))),
             &this_01->success_,(int *)in_stack_fffffffffffffd08,
             (int *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  uVar6 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar6) {
    testing::Message::Message((Message *)__a);
    testing::AssertionResult::failure_message((AssertionResult *)0x58b461);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,file,
               CONCAT13(uVar5,CONCAT12(uVar6,in_stack_fffffffffffffd1c)),&this_01->success_);
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::Message::~Message((Message *)0x58b4be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58b513);
  this_00 = &local_238;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             SUB81((ulong)this_00 >> 0x38,0));
  uVar7 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar7) {
    testing::Message::Message((Message *)__a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),expression_text,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffd68)),&this_03->success_)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,file,
               CONCAT13(uVar5,CONCAT12(uVar6,in_stack_fffffffffffffd1c)),&this_01->success_);
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_268);
    testing::Message::~Message((Message *)0x58b62a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58b6a2);
  return;
}

Assistant:

TEST(Args, Simple) {
    auto expectNoError = [](const std::string &s) { ASSERT_FALSE(true); };

    {
        int nthreads = 0;
        auto argv = makeArgs("--nthreads 4");
        EXPECT_TRUE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(nthreads, 4);
        EXPECT_TRUE(*argv == nullptr);
    }
    {
        int nthreads = 0;
        auto argv = makeArgs("--nthreads=4");
        EXPECT_TRUE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(nthreads, 4);
        EXPECT_TRUE(*argv == nullptr);
    }
}